

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  Comparator *pCVar1;
  Version *pVVar2;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->input_version_->vset_->icmp_).user_comparator_;
  lVar7 = (long)(this->level_ + 2);
  do {
    if (6 < lVar7) {
LAB_0053f28c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return 6 < lVar7;
      }
      __stack_chk_fail();
    }
    pVVar2 = this->input_version_;
    uVar6 = this->level_ptrs_[lVar7];
    while (ppFVar3 = pVVar2->files_[lVar7].
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar6 < (ulong)((long)pVVar2->files_[lVar7].
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3)) {
      pFVar4 = ppFVar3[uVar6];
      local_48 = InternalKey::user_key(&pFVar4->largest);
      iVar5 = (*pCVar1->_vptr_Comparator[2])(pCVar1,user_key,&local_48);
      if (iVar5 < 1) {
        local_48 = InternalKey::user_key(&pFVar4->smallest);
        iVar5 = (*pCVar1->_vptr_Comparator[2])(pCVar1,user_key,&local_48);
        if (-1 < iVar5) goto LAB_0053f28c;
        break;
      }
      uVar6 = this->level_ptrs_[lVar7] + 1;
      this->level_ptrs_[lVar7] = uVar6;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}